

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[6],long>
          (Capturer *this,size_t index,char (*value) [6],long *values)

{
  string local_48;
  long *local_28;
  long *values_local;
  char (*value_local) [6];
  size_t index_local;
  Capturer *this_local;
  
  local_28 = values;
  values_local = (long *)value;
  value_local = (char (*) [6])index;
  index_local = (size_t)this;
  Detail::stringify<char[6]>(&local_48,value);
  captureValue(this,index,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  captureValues<long>(this,(size_t)(*value_local + 1),local_28);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }